

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

int __thiscall
tchecker::typed_sequence_statement_t::clone
          (typed_sequence_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  typed_statement_t *ptVar1;
  typed_sequence_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::typed_statement_t> second_clone;
  shared_ptr<const_tchecker::typed_statement_t> first_clone;
  typed_sequence_statement_t *this_local;
  
  ptVar1 = first(this);
  ptVar1 = (typed_statement_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_statement_t_const>::shared_ptr<tchecker::typed_statement_t,void>
            ((shared_ptr<tchecker::typed_statement_t_const> *)
             &second_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,ptVar1);
  ptVar1 = second(this);
  ptVar1 = (typed_statement_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_statement_t_const>::shared_ptr<tchecker::typed_statement_t,void>
            ((shared_ptr<tchecker::typed_statement_t_const> *)local_30,ptVar1);
  this_00 = (typed_sequence_statement_t *)operator_new(0x38);
  typed_sequence_statement_t
            (this_00,(this->super_typed_statement_t)._type,
             (shared_ptr<const_tchecker::typed_statement_t> *)
             &second_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<const_tchecker::typed_statement_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_statement_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_statement_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_statement_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_statement_t> *)
             &second_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_sequence_statement_t * typed_sequence_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_statement_t const> first_clone{first().clone()};
  std::shared_ptr<tchecker::typed_statement_t const> second_clone{second().clone()};
  return new tchecker::typed_sequence_statement_t(_type, first_clone, second_clone);
}